

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Object Am_Get_Selection_Widget_For_Command(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Value local_68;
  Am_Object local_58;
  undefined4 local_4c;
  Am_Value local_48 [2];
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *cmd_local;
  
  pAVar2 = Am_Object::Peek(in_RSI,0x197,0);
  Am_Value::Am_Value((Am_Value *)local_28,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if (bVar1) {
    Am_Value::Am_Value(local_48,(Am_Value *)local_28);
    get_selection_widget((Am_Value *)cmd);
    Am_Value::~Am_Value(local_48);
  }
  else {
    Am_Object::Get_Object(&local_58,(Am_Slot_Key)in_RSI,0x170);
    pAVar2 = Am_Object::Peek(&local_58,0x197,0);
    Am_Value::operator=((Am_Value *)local_28,pAVar2);
    Am_Object::~Am_Object(&local_58);
    bVar1 = Am_Value::Valid((Am_Value *)local_28);
    if (bVar1) {
      Am_Value::Am_Value(&local_68,(Am_Value *)local_28);
      get_selection_widget((Am_Value *)cmd);
      Am_Value::~Am_Value(&local_68);
    }
    else {
      Am_Object::Am_Object(cmd,&Am_No_Object);
    }
  }
  local_4c = 1;
  Am_Value::~Am_Value((Am_Value *)local_28);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
Am_Get_Selection_Widget_For_Command(Am_Object cmd)
{

  Am_Value v = cmd.Peek(Am_SELECTION_WIDGET);

  if (v.Valid())
    return get_selection_widget(v);
  else {
    v = cmd.Get_Object(Am_SAVED_OLD_OWNER).Peek(Am_SELECTION_WIDGET);
    if (v.Valid())
      return get_selection_widget(v);
    else
      return Am_No_Object;
  }
}